

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Instruction.hpp
# Opt level: O0

bool InstructionSet::M68k::requires_supervisor<(InstructionSet::M68k::Model)1>(Operation op)

{
  bool local_9;
  Operation op_local;
  
  if ((((((byte)(op + DIVUw) < 2) || ((byte)(op + ORl) < 2)) || (op == MOVEtoSR)) ||
      ((op == MOVEfromSR || ((byte)(op - MOVEtoUSP) < 3)))) ||
     ((op == ANDItoSR || ((op == EORItoSR || (op == RTE)))))) {
    local_9 = true;
  }
  else {
    local_9 = false;
  }
  return local_9;
}

Assistant:

constexpr bool requires_supervisor(Operation op) {
	switch(op) {
		case Operation::MOVEfromSR:
			if constexpr (model == Model::M68000) {
				return false;
			}
			[[fallthrough]];
		case Operation::ORItoSR:	case Operation::ANDItoSR:
		case Operation::EORItoSR:	case Operation::RTE:
		case Operation::RESET:		case Operation::STOP:
		case Operation::MOVEtoUSP:	case Operation::MOVEfromUSP:
		case Operation::MOVEtoC:	case Operation::MOVEfromC:
		case Operation::MOVEtoSR:
			return true;

		default:
			return false;
	}
}